

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O3

int Cec_ManVerifyNaive(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  sat_solver *s;
  long lVar9;
  Gia_Obj_t *pGVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  timespec ts;
  uint local_a4;
  ulong local_90;
  uint local_84;
  undefined8 local_78;
  lit local_70;
  uint local_6c;
  ProgressBar *local_68;
  Cec_ParCec_t *local_60;
  timespec local_58;
  long local_48;
  Cnf_Dat_t *local_40;
  ulong local_38;
  
  local_60 = pPars;
  local_40 = Mf_ManGenerateCnf(p,8,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  iVar5 = clock_gettime(3,&local_58);
  if (iVar5 < 0) {
    local_48 = -1;
  }
  else {
    local_48 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  iVar5 = p->vCos->nSize - p->nRegs;
  local_6c = iVar5 / 2;
  local_68 = Extra_ProgressBarStart(_stdout,local_6c);
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("Gia_ManPoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                  ,0xed,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
  }
  local_84 = 0;
  uVar7 = 0;
  local_90 = 0;
  local_a4 = 0;
  if (1 < iVar5) {
    local_38 = (ulong)local_6c;
    lVar13 = 1;
    uVar12 = 0;
    local_90 = 0;
    uVar7 = 0;
    local_84 = 0;
    local_a4 = 0;
    do {
      if (((char)uVar12 == '\0') &&
         ((local_68 == (ProgressBar *)0x0 || ((long)local_68->nItemsNext <= (long)uVar12)))) {
        Extra_ProgressBarUpdate_int(local_68,(int)uVar12,(char *)0x0);
      }
      lVar9 = (long)p->vCos->nSize;
      lVar11 = lVar9 - p->nRegs;
      if (lVar11 <= lVar13 + -1) {
LAB_005a596c:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (lVar9 <= lVar13 + -1) {
LAB_005a594d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = p->vCos->pArray;
      iVar5 = piVar4[uVar12 * 2];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_005a592e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (lVar11 <= lVar13) goto LAB_005a596c;
      if (lVar9 <= lVar13) goto LAB_005a594d;
      uVar8 = piVar4[uVar12 * 2 + 1];
      if (((long)(int)uVar8 < 0) || ((uint)p->nObjs <= uVar8)) goto LAB_005a592e;
      pGVar10 = p->pObjs;
      pGVar1 = pGVar10 + iVar5;
      pGVar2 = pGVar10 + (int)uVar8;
      iVar5 = (int)local_90;
      if (((ulong)((uint)(*(ulong *)pGVar1 >> 0x1d) & 1) ^
          (ulong)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff))) ==
          ((ulong)((uint)(*(ulong *)pGVar2 >> 0x1d) & 1) ^
          (ulong)(pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff)))) {
        local_90 = (ulong)(iVar5 + 1);
        local_84 = local_84 + 1;
      }
      else {
        if (local_60->TimeLimit != 0) {
          iVar6 = clock_gettime(3,&local_58);
          if (iVar6 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
          }
          if ((long)local_60->TimeLimit <= (lVar9 - local_48) / 1000000) {
            printf("Timeout (%d sec) is reached.\n");
            local_a4 = local_6c - (uVar7 + iVar5);
            break;
          }
          pGVar10 = p->pObjs;
        }
        if ((((pGVar1 < pGVar10) || (pGVar10 + p->nObjs <= pGVar1)) || (pGVar2 < pGVar10)) ||
           (pGVar10 + p->nObjs <= pGVar2)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar6 = local_40->pVarNums[(int)((ulong)((long)pGVar1 - (long)pGVar10) >> 2) * -0x55555555];
        if ((iVar6 < 0) ||
           (iVar3 = local_40->pVarNums
                    [(int)((ulong)((long)pGVar2 - (long)pGVar10) >> 2) * -0x55555555], iVar3 < 0)) {
          __assert_fail("iVar0 >= 0 && iVar1 >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                        ,0x102,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
        }
        local_78 = CONCAT44(iVar3 * 2,iVar6 * 2 + 1);
        iVar6 = sat_solver_solve(s,(lit *)&local_78,&local_70,(long)local_60->nBTLimit,0,0,0);
        if (iVar6 == 1) {
LAB_005a57de:
          printf("Output %d is SAT.\n",uVar12 & 0xffffffff);
          uVar7 = uVar7 + 1;
        }
        else {
          if (iVar6 == -1) {
            local_78 = local_78 ^ 0x100000001;
            iVar6 = sat_solver_addclause(s,(lit *)&local_78,&local_70);
            if (iVar6 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                            ,0x10d,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
            }
            iVar6 = sat_solver_solve(s,(lit *)&local_78,&local_70,(long)local_60->nBTLimit,0,0,0);
            if (iVar6 == 1) goto LAB_005a57de;
            if (iVar6 == -1) {
              local_78 = local_78 ^ 0x100000001;
              iVar6 = sat_solver_addclause(s,(lit *)&local_78,&local_70);
              if (iVar6 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                              ,0x121,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
              }
              local_90 = (ulong)(iVar5 + 1);
              goto LAB_005a5806;
            }
          }
          local_a4 = local_a4 + 1;
        }
      }
LAB_005a5806:
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 2;
    } while (local_38 != uVar12);
  }
  Extra_ProgressBarStop(local_68);
  printf("UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ",local_90,(ulong)uVar7,
         (ulong)local_a4,(ulong)local_84);
  iVar6 = 3;
  iVar5 = clock_gettime(3,&local_58);
  if (iVar5 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  lVar13 = lVar13 - local_48;
  Abc_Print(iVar6,"%s =","Time");
  Abc_Print(iVar6,"%9.2f sec\n",(double)lVar13 / 1000000.0);
  Cnf_DataFree(local_40);
  sat_solver_delete(s);
  uVar8 = -(uint)(local_a4 != 0) | 1;
  if (uVar7 != 0) {
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

int Cec_ManVerifyNaive( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Gia_Obj_t * pObj0, * pObj1;
    abctime clkStart = Abc_Clock();
    int nPairs = Gia_ManPoNum(p)/2;
    int nUnsats = 0, nSats = 0, nUndecs = 0, nTrivs = 0;
    int i, iVar0, iVar1, pLits[2], status, RetValue;
    ProgressBar * pProgress = Extra_ProgressBarStart( stdout, nPairs );
    assert( Gia_ManPoNum(p) % 2 == 0 );
    for ( i = 0; i < nPairs; i++ )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        pObj0 = Gia_ManPo(p, 2*i);
        pObj1 = Gia_ManPo(p, 2*i+1);
        if ( Gia_ObjChild0(pObj0) == Gia_ObjChild0(pObj1) )
        {
            nUnsats++;
            nTrivs++;
            continue;
        }
        if ( pPars->TimeLimit && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->TimeLimit )
        {
            printf( "Timeout (%d sec) is reached.\n", pPars->TimeLimit );
            nUndecs = nPairs - nUnsats - nSats;
            break;
        }
        iVar0 = pCnf->pVarNums[ Gia_ObjId(p, pObj0) ];
        iVar1 = pCnf->pVarNums[ Gia_ObjId(p, pObj1) ];
        assert( iVar0 >= 0 && iVar1 >= 0 );
        pLits[0] = Abc_Var2Lit( iVar0, 0 );
        pLits[1] = Abc_Var2Lit( iVar1, 0 );
        // check direct
        pLits[0] = lit_neg(pLits[0]);
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        // check inverse
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        nUnsats++;
    }
    Extra_ProgressBarStop( pProgress );
    printf( "UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ", nUnsats, nSats, nUndecs, nTrivs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( nSats )
        return 0;
    if ( nUndecs )
        return -1;
    return 1;
}